

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35],capnp::Text::Reader&,capnp::Text::Reader&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,char (*params_1) [35],Reader *params_2,Reader *params_3)

{
  undefined4 in_register_00000014;
  char (*params_00) [35];
  Reader *params_01;
  Reader *params_02;
  long lVar1;
  String argValues [4];
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugExpression<bool>&>
            (argValues,(kj *)params,(DebugExpression<bool> *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[35]>(argValues + 1,(kj *)params_1,params_00);
  str<capnp::Text::Reader&>(argValues + 2,(kj *)params_2,params_01);
  str<capnp::Text::Reader&>(argValues + 3,(kj *)params_3,params_02);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}